

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_ARB_imaging(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_imaging != 0) {
    glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor",userptr);
    glad_glConvolutionParameteri =
         (PFNGLCONVOLUTIONPARAMETERIPROC)(*load)("glConvolutionParameteri",userptr);
    glad_glGetConvolutionParameteriv =
         (PFNGLGETCONVOLUTIONPARAMETERIVPROC)(*load)("glGetConvolutionParameteriv",userptr);
    glad_glGetMinmaxParameterfv =
         (PFNGLGETMINMAXPARAMETERFVPROC)(*load)("glGetMinmaxParameterfv",userptr);
    glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation",userptr);
    glad_glColorTableParameteriv =
         (PFNGLCOLORTABLEPARAMETERIVPROC)(*load)("glColorTableParameteriv",userptr);
    glad_glColorTable = (PFNGLCOLORTABLEPROC)(*load)("glColorTable",userptr);
    glad_glConvolutionParameteriv =
         (PFNGLCONVOLUTIONPARAMETERIVPROC)(*load)("glConvolutionParameteriv",userptr);
    glad_glGetMinmax = (PFNGLGETMINMAXPROC)(*load)("glGetMinmax",userptr);
    glad_glMinmax = (PFNGLMINMAXPROC)(*load)("glMinmax",userptr);
    glad_glCopyColorSubTable = (PFNGLCOPYCOLORSUBTABLEPROC)(*load)("glCopyColorSubTable",userptr);
    glad_glConvolutionFilter2D =
         (PFNGLCONVOLUTIONFILTER2DPROC)(*load)("glConvolutionFilter2D",userptr);
    glad_glGetSeparableFilter = (PFNGLGETSEPARABLEFILTERPROC)(*load)("glGetSeparableFilter",userptr)
    ;
    glad_glGetColorTableParameteriv =
         (PFNGLGETCOLORTABLEPARAMETERIVPROC)(*load)("glGetColorTableParameteriv",userptr);
    glad_glCopyColorTable = (PFNGLCOPYCOLORTABLEPROC)(*load)("glCopyColorTable",userptr);
    glad_glSeparableFilter2D = (PFNGLSEPARABLEFILTER2DPROC)(*load)("glSeparableFilter2D",userptr);
    glad_glCopyConvolutionFilter1D =
         (PFNGLCOPYCONVOLUTIONFILTER1DPROC)(*load)("glCopyConvolutionFilter1D",userptr);
    glad_glConvolutionParameterfv =
         (PFNGLCONVOLUTIONPARAMETERFVPROC)(*load)("glConvolutionParameterfv",userptr);
    glad_glGetConvolutionFilter =
         (PFNGLGETCONVOLUTIONFILTERPROC)(*load)("glGetConvolutionFilter",userptr);
    glad_glColorTableParameterfv =
         (PFNGLCOLORTABLEPARAMETERFVPROC)(*load)("glColorTableParameterfv",userptr);
    glad_glResetMinmax = (PFNGLRESETMINMAXPROC)(*load)("glResetMinmax",userptr);
    glad_glCopyConvolutionFilter2D =
         (PFNGLCOPYCONVOLUTIONFILTER2DPROC)(*load)("glCopyConvolutionFilter2D",userptr);
    glad_glHistogram = (PFNGLHISTOGRAMPROC)(*load)("glHistogram",userptr);
    glad_glConvolutionParameterf =
         (PFNGLCONVOLUTIONPARAMETERFPROC)(*load)("glConvolutionParameterf",userptr);
    glad_glGetMinmaxParameteriv =
         (PFNGLGETMINMAXPARAMETERIVPROC)(*load)("glGetMinmaxParameteriv",userptr);
    glad_glGetHistogramParameterfv =
         (PFNGLGETHISTOGRAMPARAMETERFVPROC)(*load)("glGetHistogramParameterfv",userptr);
    glad_glGetColorTable = (PFNGLGETCOLORTABLEPROC)(*load)("glGetColorTable",userptr);
    glad_glGetConvolutionParameterfv =
         (PFNGLGETCONVOLUTIONPARAMETERFVPROC)(*load)("glGetConvolutionParameterfv",userptr);
    glad_glResetHistogram = (PFNGLRESETHISTOGRAMPROC)(*load)("glResetHistogram",userptr);
    glad_glConvolutionFilter1D =
         (PFNGLCONVOLUTIONFILTER1DPROC)(*load)("glConvolutionFilter1D",userptr);
    glad_glGetColorTableParameterfv =
         (PFNGLGETCOLORTABLEPARAMETERFVPROC)(*load)("glGetColorTableParameterfv",userptr);
    glad_glGetHistogram = (PFNGLGETHISTOGRAMPROC)(*load)("glGetHistogram",userptr);
    glad_glGetHistogramParameteriv =
         (PFNGLGETHISTOGRAMPARAMETERIVPROC)(*load)("glGetHistogramParameteriv",userptr);
    glad_glColorSubTable = (PFNGLCOLORSUBTABLEPROC)(*load)("glColorSubTable",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_imaging( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_imaging) return;
    glBlendColor = (PFNGLBLENDCOLORPROC) load("glBlendColor", userptr);
    glConvolutionParameteri = (PFNGLCONVOLUTIONPARAMETERIPROC) load("glConvolutionParameteri", userptr);
    glGetConvolutionParameteriv = (PFNGLGETCONVOLUTIONPARAMETERIVPROC) load("glGetConvolutionParameteriv", userptr);
    glGetMinmaxParameterfv = (PFNGLGETMINMAXPARAMETERFVPROC) load("glGetMinmaxParameterfv", userptr);
    glBlendEquation = (PFNGLBLENDEQUATIONPROC) load("glBlendEquation", userptr);
    glColorTableParameteriv = (PFNGLCOLORTABLEPARAMETERIVPROC) load("glColorTableParameteriv", userptr);
    glColorTable = (PFNGLCOLORTABLEPROC) load("glColorTable", userptr);
    glConvolutionParameteriv = (PFNGLCONVOLUTIONPARAMETERIVPROC) load("glConvolutionParameteriv", userptr);
    glGetMinmax = (PFNGLGETMINMAXPROC) load("glGetMinmax", userptr);
    glMinmax = (PFNGLMINMAXPROC) load("glMinmax", userptr);
    glCopyColorSubTable = (PFNGLCOPYCOLORSUBTABLEPROC) load("glCopyColorSubTable", userptr);
    glConvolutionFilter2D = (PFNGLCONVOLUTIONFILTER2DPROC) load("glConvolutionFilter2D", userptr);
    glGetSeparableFilter = (PFNGLGETSEPARABLEFILTERPROC) load("glGetSeparableFilter", userptr);
    glGetColorTableParameteriv = (PFNGLGETCOLORTABLEPARAMETERIVPROC) load("glGetColorTableParameteriv", userptr);
    glCopyColorTable = (PFNGLCOPYCOLORTABLEPROC) load("glCopyColorTable", userptr);
    glSeparableFilter2D = (PFNGLSEPARABLEFILTER2DPROC) load("glSeparableFilter2D", userptr);
    glCopyConvolutionFilter1D = (PFNGLCOPYCONVOLUTIONFILTER1DPROC) load("glCopyConvolutionFilter1D", userptr);
    glConvolutionParameterfv = (PFNGLCONVOLUTIONPARAMETERFVPROC) load("glConvolutionParameterfv", userptr);
    glGetConvolutionFilter = (PFNGLGETCONVOLUTIONFILTERPROC) load("glGetConvolutionFilter", userptr);
    glColorTableParameterfv = (PFNGLCOLORTABLEPARAMETERFVPROC) load("glColorTableParameterfv", userptr);
    glResetMinmax = (PFNGLRESETMINMAXPROC) load("glResetMinmax", userptr);
    glCopyConvolutionFilter2D = (PFNGLCOPYCONVOLUTIONFILTER2DPROC) load("glCopyConvolutionFilter2D", userptr);
    glHistogram = (PFNGLHISTOGRAMPROC) load("glHistogram", userptr);
    glConvolutionParameterf = (PFNGLCONVOLUTIONPARAMETERFPROC) load("glConvolutionParameterf", userptr);
    glGetMinmaxParameteriv = (PFNGLGETMINMAXPARAMETERIVPROC) load("glGetMinmaxParameteriv", userptr);
    glGetHistogramParameterfv = (PFNGLGETHISTOGRAMPARAMETERFVPROC) load("glGetHistogramParameterfv", userptr);
    glGetColorTable = (PFNGLGETCOLORTABLEPROC) load("glGetColorTable", userptr);
    glGetConvolutionParameterfv = (PFNGLGETCONVOLUTIONPARAMETERFVPROC) load("glGetConvolutionParameterfv", userptr);
    glResetHistogram = (PFNGLRESETHISTOGRAMPROC) load("glResetHistogram", userptr);
    glConvolutionFilter1D = (PFNGLCONVOLUTIONFILTER1DPROC) load("glConvolutionFilter1D", userptr);
    glGetColorTableParameterfv = (PFNGLGETCOLORTABLEPARAMETERFVPROC) load("glGetColorTableParameterfv", userptr);
    glGetHistogram = (PFNGLGETHISTOGRAMPROC) load("glGetHistogram", userptr);
    glGetHistogramParameteriv = (PFNGLGETHISTOGRAMPARAMETERIVPROC) load("glGetHistogramParameteriv", userptr);
    glColorSubTable = (PFNGLCOLORSUBTABLEPROC) load("glColorSubTable", userptr);
}